

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

bool __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::assertionEnded
          (CumulativeReporterBase<Catch::JunitReporter> *this,AssertionStats *assertionStats)

{
  prepareExpandedExpression(&assertionStats->assertionResult);
  clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::push_back
            (&((this->m_sectionStack).
               super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->assertions,assertionStats);
  return true;
}

Assistant:

bool assertionEnded(AssertionStats const& assertionStats) override {
            assert(!m_sectionStack.empty());
            // AssertionResult holds a pointer to a temporary DecomposedExpression,
            // which getExpandedExpression() calls to build the expression string.
            // Our section stack copy of the assertionResult will likely outlive the
            // temporary, so it must be expanded or discarded now to avoid calling
            // a destroyed object later.
            prepareExpandedExpression(const_cast<AssertionResult&>( assertionStats.assertionResult ) );
            SectionNode& sectionNode = *m_sectionStack.back();
            sectionNode.assertions.push_back(assertionStats);
            return true;
        }